

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O1

int tnt_object_verify(tnt_stream *obj,int8_t type)

{
  int iVar1;
  int iVar2;
  byte *end;
  byte *local_18;
  char *pos;
  
  local_18 = *obj->data;
  end = local_18 + *(long *)((long)obj->data + 8);
  if ((type < '\0') || (iVar2 = -1, mp_type_hint[*local_18] == (uint)(byte)type)) {
    iVar1 = mp_check((char **)&local_18,(char *)end);
    iVar2 = -1;
    if (iVar1 == 0) {
      iVar2 = -(uint)(local_18 < end);
    }
  }
  return iVar2;
}

Assistant:

int tnt_object_verify(struct tnt_stream *obj, int8_t type)
{
	const char *pos = TNT_SBUF_DATA(obj);
	const char *end = pos + TNT_SBUF_SIZE(obj);
	if (type >= 0 && mp_typeof(*pos) != (uint8_t) type) return -1;
	if (mp_check(&pos, end)) return -1;
	if (pos < end) return -1;
	return 0;
}